

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O0

int codepoint(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  uint local_4c;
  ulong uStack_48;
  utfint code;
  char *se;
  int n;
  int lax;
  lua_Integer pose;
  lua_Integer posi;
  char *s;
  size_t len;
  lua_State *L_local;
  
  len = (size_t)L;
  posi = (lua_Integer)luaL_checklstring(L,1,(size_t *)&s);
  lVar2 = luaL_optinteger((lua_State *)len,2,1);
  pose = u_posrelat(lVar2,(size_t)s);
  lVar2 = luaL_optinteger((lua_State *)len,3,pose);
  _n = u_posrelat(lVar2,(size_t)s);
  se._4_4_ = lua_toboolean((lua_State *)len,4);
  if (pose < 1) {
    luaL_argerror((lua_State *)len,2,"out of bounds");
  }
  if ((long)s < _n) {
    luaL_argerror((lua_State *)len,3,"out of bounds");
  }
  if (_n < pose) {
    L_local._4_4_ = 0;
  }
  else if (_n - pose < 0x7fffffff) {
    se._0_4_ = ((int)_n - (int)pose) + 1;
    luaL_checkstack((lua_State *)len,(int)se,"string slice too long");
    se._0_4_ = 0;
    uStack_48 = posi + _n;
    posi = pose + -1 + posi;
    while ((ulong)posi < uStack_48) {
      posi = (lua_Integer)utf8_decode((char *)posi,&local_4c,(uint)((se._4_4_ != 0 ^ 0xffU) & 1));
      if ((char *)posi == (char *)0x0) {
        iVar1 = luaL_error((lua_State *)len,"invalid UTF-8 code");
        return iVar1;
      }
      lua_pushinteger((lua_State *)len,(ulong)local_4c);
      se._0_4_ = (int)se + 1;
    }
    L_local._4_4_ = (int)se;
  }
  else {
    L_local._4_4_ = luaL_error((lua_State *)len,"string slice too long");
  }
  return L_local._4_4_;
}

Assistant:

static int codepoint (lua_State *L) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer posi = u_posrelat(luaL_optinteger(L, 2, 1), len);
  lua_Integer pose = u_posrelat(luaL_optinteger(L, 3, posi), len);
  int lax = lua_toboolean(L, 4);
  int n;
  const char *se;
  luaL_argcheck(L, posi >= 1, 2, "out of bounds");
  luaL_argcheck(L, pose <= (lua_Integer)len, 3, "out of bounds");
  if (posi > pose) return 0;  /* empty interval; return no values */
  if (pose - posi >= INT_MAX)  /* (lua_Integer -> int) overflow? */
    return luaL_error(L, "string slice too long");
  n = (int)(pose -  posi) + 1;  /* upper bound for number of returns */
  luaL_checkstack(L, n, "string slice too long");
  n = 0;  /* count the number of returns */
  se = s + pose;  /* string end */
  for (s += posi - 1; s < se;) {
    utfint code;
    s = utf8_decode(s, &code, !lax);
    if (s == NULL)
      return luaL_error(L, MSGInvalid);
    lua_pushinteger(L, code);
    n++;
  }
  return n;
}